

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O3

size_t derEnc(octet *der,u32 tag,void *val,size_t len)

{
  bool bVar1;
  bool_t bVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  size_t sVar6;
  long lVar7;
  size_t sVar8;
  
  uVar5 = (ulong)tag;
  bVar2 = derTIsValid(tag);
  if (bVar2 == 0) {
    return 0xffffffffffffffff;
  }
  lVar7 = 0;
  if (tag != 0) {
    do {
      lVar7 = lVar7 + 1;
      uVar3 = (uint)uVar5;
      uVar5 = uVar5 >> 8;
    } while (0xff < uVar3);
  }
  sVar8 = lVar7 + (ulong)(lVar7 == 0);
  sVar6 = 1;
  uVar5 = len;
  if (0x7f < len) {
    do {
      sVar6 = sVar6 + 1;
      bVar1 = 0xff < uVar5;
      uVar5 = uVar5 >> 8;
    } while (bVar1);
  }
  if (der != (octet *)0x0) {
    memMove(der + sVar8 + sVar6,val,len);
    sVar4 = derTEnc(der,tag);
    if (sVar4 != sVar8) {
      return 0xffffffffffffffff;
    }
    sVar4 = derLEnc(der + sVar8,len);
    if (sVar4 != sVar6) {
      return 0xffffffffffffffff;
    }
  }
  return sVar8 + len + sVar6;
}

Assistant:

size_t derEnc(octet der[], u32 tag, const void* val, size_t len)
{
	size_t t_count;
	size_t l_count;
	// t_count <- len(T)
	t_count = derTEnc(0, tag);
	if (t_count == SIZE_MAX)
		return SIZE_MAX;
	// l_count <- len(L)
	l_count = derLEnc(0, len);
	if (l_count == SIZE_MAX)
		return SIZE_MAX;
	// кодировать?
	if (der)
	{
		ASSERT(memIsValid(val, len));
		ASSERT(memIsValid(der, t_count + l_count + len));
		// der <- TLV
		memMove(der + t_count + l_count, val, len);
		if (derTEnc(der, tag) != t_count ||
			derLEnc(der + t_count, len) != l_count)
			return SIZE_MAX;
	}
	return t_count + l_count + len;
}